

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O1

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s,RK_U8 *src,int length,HEVCNAL *nal)

{
  RK_U8 RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RK_U8 *pRVar5;
  
  s->skipped_bytes = 0;
  iVar3 = length;
  if (1 < length) {
    iVar2 = 0;
    do {
      iVar4 = iVar2;
      if ((~(0x1000100 - *(uint *)(src + iVar2) | *(uint *)(src + iVar2)) & 0x80008080) != 0) {
        if (0 < iVar2) {
          iVar2 = iVar2 - (uint)(src[iVar2] == '\0');
        }
        pRVar5 = src + iVar2;
        iVar3 = iVar2 + -1;
        do {
          iVar4 = iVar3;
          iVar3 = iVar4 + 1;
          RVar1 = *pRVar5;
          pRVar5 = pRVar5 + 1;
        } while (RVar1 != '\0');
        if (((iVar4 + 3 < length) && (*pRVar5 == '\0')) && (src[iVar4 + 3] < 2)) break;
        iVar4 = iVar4 + -2;
      }
      iVar2 = iVar4 + 5;
      iVar3 = length;
    } while (iVar4 + 6 < length);
  }
  iVar2 = iVar3 + 8;
  if (nal->rbsp_buffer_size < iVar2) {
    mpp_osal_free("mpp_hevc_extract_rbsp",nal->rbsp_buffer);
    nal->rbsp_buffer = (RK_U8 *)0x0;
    iVar4 = iVar2 * 0x11 + 0xf;
    if (-1 < iVar2 * 0x11) {
      iVar4 = iVar2 * 0x11;
    }
    iVar4 = (iVar4 >> 4) + 0x20;
    if (iVar4 <= iVar2) {
      iVar4 = iVar2;
    }
    pRVar5 = (RK_U8 *)mpp_osal_malloc("mpp_hevc_extract_rbsp",(long)iVar4);
    nal->rbsp_buffer = pRVar5;
    if (pRVar5 == (RK_U8 *)0x0) {
      iVar4 = 0;
    }
    nal->rbsp_buffer_size = iVar4;
  }
  memcpy(nal->rbsp_buffer,src,(long)iVar3);
  nal->data = nal->rbsp_buffer;
  nal->size = iVar3;
  pRVar5 = nal->rbsp_buffer + iVar3;
  pRVar5[0] = '\0';
  pRVar5[1] = '\0';
  pRVar5[2] = '\0';
  pRVar5[3] = '\0';
  pRVar5[4] = '\0';
  pRVar5[5] = '\0';
  pRVar5[6] = '\0';
  pRVar5[7] = '\0';
  return iVar3;
}

Assistant:

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s, const RK_U8 *src, int length,
                             HEVCNAL *nal)
{
    RK_S32 i;

    s->skipped_bytes = 0;

#define STARTCODE_TEST                                              \
    if (i + 2 < length && src[i + 1] == 0 && src[i + 2] < 2) {      \
            /* startcode, so we must be past the end */             \
        length = i;                                                 \
        break;                                                      \
    }